

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

mat4 * __thiscall Camera::get_projection(mat4 *__return_storage_ptr__,Camera *this,float aspect)

{
  float fovy;
  float aspect_local;
  Camera *this_local;
  
  fovy = glm::radians<float>(this->FoV);
  glm::perspective<float>(__return_storage_ptr__,fovy,aspect,this->z_near,this->z_far);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::get_projection(float aspect) {
    // std::cout << FoV << std::endl;
    return glm::perspective(
        glm::radians(FoV),
        aspect,
        z_near,
        z_far
    );
}